

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void panicuraid(int sig,siginfo_t *info,void *context)

{
  __pid_t __pgrp;
  char *pcVar1;
  void *context_local;
  siginfo_t *info_local;
  int sig_local;
  
  switch(sig) {
  case 1:
    snprintf(panicuraid::errormsg,200,"HANGUP signalled.\n%s",panicuraid::stdmsg);
    __pgrp = getpgrp();
    killpg(__pgrp,9);
    exit(0);
  default:
    pcVar1 = strsignal(sig);
    snprintf(panicuraid::errormsg,200,"Uncaught SIGNAL %s (%d).\n%s",pcVar1,(ulong)(uint)sig,
             panicuraid::stdmsg);
    break;
  case 4:
  case 7:
  case 0xb:
    pcVar1 = strsignal(sig);
    snprintf(panicuraid::errormsg,200,"%s at address %p.\n%s",pcVar1,
             (info->_sifields)._sigfault.si_addr,panicuraid::stdmsg);
    break;
  case 8:
    pcVar1 = strsignal(sig);
    snprintf(panicuraid::errormsg,200,"%s (%d) at address %p.\n%s",pcVar1,(ulong)(uint)info->si_code
             ,(info->_sifields)._sigfault.si_addr,panicuraid::stdmsg);
    break;
  case 0xd:
    snprintf(panicuraid::errormsg,200,"Broken PIPE.\n%s",panicuraid::stdmsg);
  }
  error(panicuraid::errormsg);
  return;
}

Assistant:

static void panicuraid(int sig, siginfo_t *info, void *context)
{
  static char errormsg[200];
  static char *stdmsg =
      "Please record the signal and code information\n\
and do a 'v' before trying anything else.";

  switch (sig) {
    case SIGBUS:
    case SIGILL:
    case SIGSEGV:
      snprintf(errormsg, sizeof(errormsg), "%s at address %p.\n%s", strsignal(sig), info->si_addr, stdmsg);
      break;
    case SIGPIPE:
      snprintf(errormsg, sizeof(errormsg), "Broken PIPE.\n%s", stdmsg);
      break;
    case SIGHUP:
      snprintf(errormsg, sizeof(errormsg), "HANGUP signalled.\n%s", stdmsg);
      /* Assume that a user tried to exit UNIX shell */
      killpg(getpgrp(), SIGKILL);
      exit(0);
    case SIGFPE:
      snprintf(errormsg, sizeof(errormsg), "%s (%d) at address %p.\n%s", strsignal(sig), info->si_code, info->si_addr, stdmsg);
      break;
    default: snprintf(errormsg, sizeof(errormsg), "Uncaught SIGNAL %s (%d).\n%s", strsignal(sig), sig, stdmsg);
  }

  error(errormsg);
}